

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall asl::String::fixW(String *this)

{
  int iVar1;
  size_t sVar2;
  int n;
  anon_union_16_2_78e7fdac_for_String_2 *u;
  anon_union_16_2_78e7fdac_for_String_2 *__s;
  
  iVar1 = this->_size;
  __s = &this->field_2;
  u = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  if (iVar1 == 0) {
    u = __s;
  }
  n = 0x10;
  if (iVar1 != 0) {
    n = iVar1;
  }
  utf16toUtf8((wchar_t *)(u->_space + (int)(this->_len + (3U - this->_len & 3) + 1)),u->_space,n);
  if (this->_size != 0) {
    __s = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  sVar2 = strlen(__s->_space);
  this->_len = (int)sVar2;
  return this;
}

Assistant:

String& String::fixW()
{
	int offset = (_len + 1) + ((4 - ((_len + 1) & 0x03)) & 0x03);
	to8bit((wchar_t*)(str() + offset), str(), cap());
	_len = (int)strlen(str());
	return *this;
}